

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorTest.cpp
# Opt level: O1

void __thiscall IteratorTest_ConstIterator_Test::TestBody(IteratorTest_ConstIterator_Test *this)

{
  int iVar1;
  bool bVar2;
  char *message;
  AssertionResult gtest_ar;
  pair<Deque<int,_std::allocator<int>_>::DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  p;
  deque<int,_std::allocator<int>_> stdDeque;
  Deque<int,_std::allocator<int>_> myDeque;
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
  local_178;
  AssertHelper local_168;
  Deque<int,_std::allocator<int>_> *local_160;
  _Elt_pointer local_158;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_150;
  _Elt_pointer piStack_148;
  _Map_pointer ppiStack_140;
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
  local_138 [3];
  _Deque_base<int,_std::allocator<int>_> local_108;
  Deque<int,_std::allocator<int>_> local_b0;
  
  Deque<int,_std::allocator<int>_>::Deque(&local_b0,(allocator<int> *)&local_108);
  local_108._M_impl.super__Deque_impl_data._0_16_ = ZEXT816(0) << 0x40;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_108,0);
  local_138[0].n_._0_4_ = 0;
  do {
    Deque<int,_std::allocator<int>_>::push_back(&local_b0,(value_type *)local_138);
    if (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_108._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&local_108,(int *)local_138);
    }
    else {
      *local_108._M_impl.super__Deque_impl_data._M_finish._M_cur = (int)local_138[0].n_;
      local_108._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_108._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    iVar1 = (int)local_138[0].n_ + 1;
    bVar2 = (int)local_138[0].n_ < 99;
    local_138[0].n_._0_4_ = iVar1;
  } while (bVar2);
  local_168.data_ = (AssertHelperData *)Deque<int,_std::allocator<int>_>::size(&local_b0);
  local_178.n_ = 0;
  local_158 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
  sStack_150.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_108._M_impl.super__Deque_impl_data._M_start._M_first;
  piStack_148 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
  ppiStack_140 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
  local_178.deque_ = &local_b0;
  local_160 = &local_b0;
  std::
  __mismatch<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,std::_Deque_iterator<int,int_const&,int_const*>,__gnu_cxx::__ops::_Iter_equal_to_iter>
            (local_138);
  local_178.n_ = Deque<int,_std::allocator<int>_>::size(&local_b0);
  local_178.deque_ = &local_b0;
  testing::internal::
  CmpHelperEQ<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>>
            ((internal *)&local_158,"p.first","myDeque.cend()",local_138,&local_178);
  if (local_158._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (sStack_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((sStack_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/IteratorTest.cpp"
               ,0x12,message);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((long *)local_178.n_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_178.n_ != (long *)0x0)) {
        (**(code **)(*(long *)local_178.n_ + 8))();
      }
      local_178.n_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_108);
  Deque<int,_std::allocator<int>_>::~Deque(&local_b0);
  return;
}

Assistant:

TEST(IteratorTest, ConstIterator) {
    Deque<int> myDeque;
    std::deque<int> stdDeque;
    for (int i = 0; i < 100; ++i) {
        myDeque.push_back(i);
        stdDeque.push_back(i);
    }
    auto p = std::mismatch(myDeque.cbegin(), myDeque.cend(), stdDeque.cbegin());
    ASSERT_EQ(p.first, myDeque.cend());
}